

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void capnp::compiler::findImports
               (Reader paramList,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  Reader exp;
  Reader exp_00;
  Reader exp_01;
  ListElementCount LVar1;
  short sVar2;
  ElementCount index;
  ElementCount index_00;
  Reader param;
  Reader ann;
  StructReader local_1a0;
  StructReader local_170;
  PointerReader local_140;
  ListReader local_120;
  StructReader local_f0;
  StructReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  if (paramList._reader.dataSize < 0x10) {
    sVar2 = 0;
  }
  else {
    sVar2 = *paramList._reader.data;
  }
  if (sVar2 == 2) {
    local_90.segment = (SegmentReader *)0x21c1bd;
    local_90.capTable = (CapTableReader *)0x14;
    std::
    _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
    ::_M_insert_unique<kj::StringPtr>(&output->_M_t,(StringPtr *)&local_90);
  }
  else if (sVar2 == 1) {
    if (paramList._reader.pointerCount == 0) {
      paramList._reader.nestingLimit = 0x7fffffff;
      paramList._reader.capTable = (CapTableReader *)0x0;
      paramList._reader.pointers = (WirePointer *)0x0;
      paramList._reader.segment = (SegmentReader *)0x0;
    }
    local_90.segment = paramList._reader.segment;
    local_90.capTable = paramList._reader.capTable;
    local_90.ptr = (byte *)paramList._reader.pointers;
    local_90.elementCount = paramList._reader.nestingLimit;
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_90,(word *)0x0);
    exp._reader.capTable = local_60.capTable;
    exp._reader.segment = local_60.segment;
    exp._reader.data = local_60.data;
    exp._reader.pointers = local_60.pointers;
    exp._reader.dataSize = local_60.dataSize;
    exp._reader.pointerCount = local_60.pointerCount;
    exp._reader._38_2_ = local_60._38_2_;
    exp._reader.nestingLimit = local_60.nestingLimit;
    exp._reader._44_4_ = local_60._44_4_;
    findImports(exp,output);
  }
  else if (sVar2 == 0) {
    if (paramList._reader.pointerCount == 0) {
      paramList._reader.nestingLimit = 0x7fffffff;
      paramList._reader.capTable = (CapTableReader *)0x0;
      paramList._reader.pointers = (WirePointer *)0x0;
      paramList._reader.segment = (SegmentReader *)0x0;
    }
    index = 0;
    local_1a0.segment = paramList._reader.segment;
    local_1a0.capTable = paramList._reader.capTable;
    local_1a0.data = paramList._reader.pointers;
    local_1a0.pointers._0_4_ = paramList._reader.nestingLimit;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_1a0,INLINE_COMPOSITE,(word *)0x0);
    if (local_90.elementCount != 0) {
      do {
        capnp::_::ListReader::getStructElement(&local_1a0,&local_90,index);
        if (local_1a0.pointerCount < 2) {
          local_120.capTable = (CapTableReader *)0x0;
          local_120.ptr = (byte *)0x0;
          local_120.segment = (SegmentReader *)0x0;
          local_120.elementCount = 0x7fffffff;
        }
        else {
          local_120.ptr = (byte *)(CONCAT44(local_1a0.pointers._4_4_,(int)local_1a0.pointers) + 8);
          local_120.capTable = local_1a0.capTable;
          local_120.segment = local_1a0.segment;
          local_120.elementCount = local_1a0.nestingLimit;
        }
        capnp::_::PointerReader::getStruct(&local_c0,(PointerReader *)&local_120,(word *)0x0);
        exp_00._reader.capTable = local_c0.capTable;
        exp_00._reader.segment = local_c0.segment;
        exp_00._reader.data = local_c0.data;
        exp_00._reader.pointers = local_c0.pointers;
        exp_00._reader.dataSize = local_c0.dataSize;
        exp_00._reader.pointerCount = local_c0.pointerCount;
        exp_00._reader._38_2_ = local_c0._38_2_;
        exp_00._reader.nestingLimit = local_c0.nestingLimit;
        exp_00._reader._44_4_ = local_c0._44_4_;
        findImports(exp_00,output);
        local_170.data = (void *)0x0;
        local_170.capTable = (CapTableReader *)0x0;
        local_170.segment = (SegmentReader *)0x0;
        local_170.pointers._0_4_ = 0x7fffffff;
        if (2 < local_1a0.pointerCount) {
          local_170.data =
               (void *)(CONCAT44(local_1a0.pointers._4_4_,(int)local_1a0.pointers) + 0x10);
          local_170.capTable = local_1a0.capTable;
          local_170.segment = local_1a0.segment;
          local_170.pointers._0_4_ = local_1a0.nestingLimit;
        }
        capnp::_::PointerReader::getList
                  (&local_120,(PointerReader *)&local_170,INLINE_COMPOSITE,(word *)0x0);
        LVar1 = local_120.elementCount;
        if (local_120.elementCount != 0) {
          index_00 = 0;
          do {
            capnp::_::ListReader::getStructElement(&local_170,&local_120,index_00);
            if (local_170.pointerCount == 0) {
              local_140.nestingLimit = 0x7fffffff;
              local_140.capTable = (CapTableReader *)0x0;
              local_140.pointer = (WirePointer *)0x0;
              local_140.segment = (SegmentReader *)0x0;
            }
            else {
              local_140.pointer =
                   (WirePointer *)
                   CONCAT44(local_170.pointers._4_4_,(ElementCount)local_170.pointers);
              local_140.capTable = local_170.capTable;
              local_140.segment = local_170.segment;
              local_140.nestingLimit = local_170.nestingLimit;
            }
            capnp::_::PointerReader::getStruct(&local_f0,&local_140,(word *)0x0);
            exp_01._reader.capTable = local_f0.capTable;
            exp_01._reader.segment = local_f0.segment;
            exp_01._reader.data = local_f0.data;
            exp_01._reader.pointers = local_f0.pointers;
            exp_01._reader.dataSize = local_f0.dataSize;
            exp_01._reader.pointerCount = local_f0.pointerCount;
            exp_01._reader._38_2_ = local_f0._38_2_;
            exp_01._reader.nestingLimit = local_f0.nestingLimit;
            exp_01._reader._44_4_ = local_f0._44_4_;
            findImports(exp_01,output);
            index_00 = index_00 + 1;
          } while (LVar1 != index_00);
        }
        index = index + 1;
      } while (index != local_90.elementCount);
    }
  }
  return;
}

Assistant:

static void findImports(Declaration::ParamList::Reader paramList, std::set<kj::StringPtr>& output) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST:
      for (auto param: paramList.getNamedList()) {
        findImports(param.getType(), output);
        for (auto ann: param.getAnnotations()) {
          findImports(ann.getName(), output);
        }
      }
      break;
    case Declaration::ParamList::TYPE:
      findImports(paramList.getType(), output);
      break;
    case Declaration::ParamList::STREAM:
      output.insert("/capnp/stream.capnp");
      break;
  }
}